

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance_intersector.cpp
# Opt level: O2

bool embree::sse2::InstanceIntersector1::pointQuery
               (PointQuery *query,PointQueryContext *context,InstancePrimitive *prim)

{
  float (*pafVar1) [16];
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar5;
  Instance *pIVar6;
  AffineSpace3ff *pAVar7;
  RTCPointQueryContext *pRVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  float fVar23;
  float fVar24;
  undefined1 uVar25;
  bool bVar26;
  uint uVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  undefined8 local_98;
  float local_90;
  float local_8c;
  float local_88;
  undefined1 local_78 [16];
  long local_68;
  undefined8 local_60;
  PointQuery *local_58;
  undefined4 local_50;
  PointQueryFunction local_48;
  RTCPointQueryContext *local_40;
  float local_38;
  void *local_30;
  undefined8 local_28;
  float local_18;
  float fStack_14;
  float fStack_10;
  float fStack_c;
  
  pIVar6 = prim->instance;
  pAVar7 = pIVar6->local2world;
  if ((pIVar6->super_Geometry).field_8.field_0x1 == '\x01') {
    fVar39 = (pAVar7->p).field_0.m128[3];
    fVar40 = (pAVar7->l).vx.field_0.m128[3];
    fVar41 = (pAVar7->l).vy.field_0.m128[3];
    fVar59 = (pAVar7->l).vz.field_0.m128[3];
    aVar5 = (pAVar7->l).vx.field_0.field_1;
    fVar60 = aVar5.x;
    fVar28 = (pAVar7->l).vy.field_0.m128[0];
    fVar29 = (pAVar7->l).vy.field_0.m128[1];
    fVar36 = (pAVar7->l).vy.field_0.m128[2];
    auVar32._8_4_ = fVar36;
    auVar32._0_8_ = aVar5._4_8_;
    auVar32._12_4_ = 0;
    fVar37 = fVar40 * fVar41 + fVar39 * fVar59;
    fVar61 = fVar40 * fVar41 - fVar39 * fVar59;
    fVar62 = fVar39 * fVar39 + fVar40 * fVar40 + -fVar41 * fVar41 + -fVar59 * fVar59;
    fVar31 = fVar39 * fVar39 - fVar40 * fVar40;
    fVar35 = fVar41 * fVar41 + fVar31 + -fVar59 * fVar59;
    fVar42 = fVar40 * fVar59 - fVar39 * fVar41;
    fVar30 = fVar39 * fVar41 + fVar40 * fVar59;
    fVar38 = fVar41 * fVar59 + fVar39 * fVar40;
    fVar39 = fVar41 * fVar59 - fVar39 * fVar40;
    fVar37 = fVar37 + fVar37;
    fVar42 = fVar42 + fVar42;
    fVar40 = fVar59 * fVar59 + fVar31 + -fVar41 * fVar41;
    fVar52 = fVar62 * 1.0 + fVar37 * 0.0 + fVar42 * 0.0;
    fVar53 = fVar62 * 0.0 + fVar37 * 1.0 + fVar42 * 0.0;
    fVar55 = fVar62 * 0.0 + fVar37 * 0.0 + fVar42 * 1.0;
    fVar56 = fVar62 * 0.0 + fVar37 * 0.0 + fVar42 * 0.0;
    fVar38 = fVar38 + fVar38;
    fVar61 = fVar61 + fVar61;
    fVar45 = fVar61 * 1.0 + fVar35 * 0.0 + fVar38 * 0.0;
    fVar47 = fVar61 * 0.0 + fVar35 * 1.0 + fVar38 * 0.0;
    fVar50 = fVar61 * 0.0 + fVar35 * 0.0 + fVar38 * 1.0;
    fVar51 = fVar61 * 0.0 + fVar35 * 0.0 + fVar38 * 0.0;
    fVar35 = (pAVar7->l).vz.field_0.m128[0];
    fVar37 = (pAVar7->l).vz.field_0.m128[1];
    fVar38 = (pAVar7->l).vz.field_0.m128[2];
    fVar42 = (pAVar7->p).field_0.m128[0];
    fVar43 = (pAVar7->p).field_0.m128[1];
    fVar44 = (pAVar7->p).field_0.m128[2];
    fVar30 = fVar30 + fVar30;
    fVar39 = fVar39 + fVar39;
    fVar57 = fVar30 * 1.0 + fVar39 * 0.0 + fVar40 * 0.0;
    fVar58 = fVar30 * 0.0 + fVar39 * 1.0 + fVar40 * 0.0;
    fVar46 = fVar30 * 0.0 + fVar39 * 0.0 + fVar40 * 1.0;
    fVar48 = fVar30 * 0.0 + fVar39 * 0.0 + fVar40 * 0.0;
    local_78._0_4_ = aVar5.y;
    local_78._4_4_ = aVar5.z;
    fVar39 = fVar60 * fVar52 + fVar45 * 0.0 + fVar57 * 0.0;
    fVar40 = fVar60 * fVar53 + fVar47 * 0.0 + fVar58 * 0.0;
    fVar41 = fVar60 * fVar55 + fVar50 * 0.0 + fVar46 * 0.0;
    fVar59 = fVar60 * fVar56 + fVar51 * 0.0 + fVar48 * 0.0;
    fVar60 = fVar28 * fVar52 + fVar29 * fVar45 + fVar57 * 0.0;
    fVar61 = fVar28 * fVar53 + fVar29 * fVar47 + fVar58 * 0.0;
    fVar62 = fVar28 * fVar55 + fVar29 * fVar50 + fVar46 * 0.0;
    fVar28 = fVar28 * fVar56 + fVar29 * fVar51 + fVar48 * 0.0;
    fVar29 = fVar35 * fVar52 + fVar37 * fVar45 + fVar38 * fVar57;
    fVar30 = fVar35 * fVar53 + fVar37 * fVar47 + fVar38 * fVar58;
    fVar31 = fVar35 * fVar55 + fVar37 * fVar50 + fVar38 * fVar46;
    fVar35 = fVar35 * fVar56 + fVar37 * fVar51 + fVar38 * fVar48;
    fVar37 = fVar42 * fVar52 + fVar43 * fVar45 + fVar44 * fVar57 + (float)local_78._0_4_ + 0.0;
    fVar38 = fVar42 * fVar53 + fVar43 * fVar47 + fVar44 * fVar58 + (float)local_78._4_4_ + 0.0;
    fVar36 = fVar42 * fVar55 + fVar43 * fVar50 + fVar44 * fVar46 + fVar36 + 0.0;
    fVar42 = fVar42 * fVar56 + fVar43 * fVar51 + fVar44 * fVar48 + 0.0;
    local_78 = auVar32;
  }
  else {
    fVar39 = (pAVar7->l).vx.field_0.m128[0];
    fVar40 = (pAVar7->l).vx.field_0.m128[1];
    fVar41 = (pAVar7->l).vx.field_0.m128[2];
    fVar59 = (pAVar7->l).vx.field_0.m128[3];
    fVar60 = (pAVar7->l).vy.field_0.m128[0];
    fVar61 = (pAVar7->l).vy.field_0.m128[1];
    fVar62 = (pAVar7->l).vy.field_0.m128[2];
    fVar28 = (pAVar7->l).vy.field_0.m128[3];
    fVar29 = (pAVar7->l).vz.field_0.m128[0];
    fVar30 = (pAVar7->l).vz.field_0.m128[1];
    fVar31 = (pAVar7->l).vz.field_0.m128[2];
    fVar35 = (pAVar7->l).vz.field_0.m128[3];
    fVar37 = (pAVar7->p).field_0.m128[0];
    fVar38 = (pAVar7->p).field_0.m128[1];
    fVar36 = (pAVar7->p).field_0.m128[2];
    fVar42 = (pAVar7->p).field_0.m128[3];
  }
  fVar43 = (pIVar6->world2local0).l.vx.field_0.m128[0];
  fVar44 = (pIVar6->world2local0).l.vx.field_0.m128[1];
  fVar45 = (pIVar6->world2local0).l.vx.field_0.m128[2];
  fVar47 = (pIVar6->world2local0).l.vx.field_0.m128[3];
  fVar50 = (pIVar6->world2local0).l.vy.field_0.m128[0];
  fVar51 = (pIVar6->world2local0).l.vy.field_0.m128[1];
  fVar52 = (pIVar6->world2local0).l.vy.field_0.m128[2];
  fVar53 = (pIVar6->world2local0).l.vy.field_0.m128[3];
  fVar55 = (pIVar6->world2local0).l.vz.field_0.m128[0];
  fVar56 = (pIVar6->world2local0).l.vz.field_0.m128[1];
  fVar57 = (pIVar6->world2local0).l.vz.field_0.m128[2];
  fVar58 = (pIVar6->world2local0).l.vz.field_0.m128[3];
  fVar46 = (pIVar6->world2local0).p.field_0.m128[0];
  fVar48 = (pIVar6->world2local0).p.field_0.m128[1];
  fVar23 = (pIVar6->world2local0).p.field_0.m128[2];
  fVar24 = (pIVar6->world2local0).p.field_0.m128[3];
  local_50 = 2;
  bVar26 = true;
  local_38 = 0.0;
  if ((((context->query_type == POINT_QUERY_TYPE_SPHERE) &&
       (ABS(fVar45 * fVar52 + fVar44 * fVar51 + fVar43 * fVar50) <= 1e-05)) &&
      (ABS(fVar45 * fVar57 + fVar44 * fVar56 + fVar43 * fVar55) <= 1e-05)) &&
     (ABS(fVar52 * fVar57 + fVar51 * fVar56 + fVar50 * fVar55) <= 1e-05)) {
    fVar49 = fVar45 * fVar45 + fVar44 * fVar44 + fVar43 * fVar43;
    fVar54 = fVar52 * fVar52 + fVar51 * fVar51 + fVar50 * fVar50;
    if (((ABS(fVar49 - fVar54) <= 1e-05) &&
        (fVar63 = fVar57 * fVar57 + fVar56 * fVar56 + fVar55 * fVar55, ABS(fVar49 - fVar63) <= 1e-05
        )) && (ABS(fVar54 - fVar63) <= 1e-05)) {
      local_38 = SQRT(fVar49);
      local_50 = 1;
      bVar26 = false;
    }
  }
  pRVar8 = context->userContext;
  uVar27 = pRVar8->instStackSize;
  pRVar8->instID[uVar27] = prim->instID_;
  pRVar8->instPrimID[uVar27] = 0;
  pafVar1 = pRVar8->world2inst + uVar27;
  (*pafVar1)[0] = fVar43;
  (*pafVar1)[1] = fVar44;
  (*pafVar1)[2] = fVar45;
  (*pafVar1)[3] = fVar47;
  pfVar2 = pRVar8->world2inst[uVar27] + 4;
  *pfVar2 = fVar50;
  pfVar2[1] = fVar51;
  pfVar2[2] = fVar52;
  pfVar2[3] = fVar53;
  pfVar2 = pRVar8->world2inst[uVar27] + 8;
  *pfVar2 = fVar55;
  pfVar2[1] = fVar56;
  pfVar2[2] = fVar57;
  pfVar2[3] = fVar58;
  pfVar2 = pRVar8->world2inst[uVar27] + 0xc;
  *pfVar2 = fVar46;
  pfVar2[1] = fVar48;
  pfVar2[2] = fVar23;
  pfVar2[3] = fVar24;
  pafVar1 = pRVar8->inst2world + uVar27;
  (*pafVar1)[0] = fVar39;
  (*pafVar1)[1] = fVar40;
  (*pafVar1)[2] = fVar41;
  (*pafVar1)[3] = fVar59;
  pfVar2 = pRVar8->inst2world[uVar27] + 4;
  *pfVar2 = fVar60;
  pfVar2[1] = fVar61;
  pfVar2[2] = fVar62;
  pfVar2[3] = fVar28;
  pfVar2 = pRVar8->inst2world[uVar27] + 8;
  *pfVar2 = fVar29;
  pfVar2[1] = fVar30;
  pfVar2[2] = fVar31;
  pfVar2[3] = fVar35;
  pfVar2 = pRVar8->inst2world[uVar27] + 0xc;
  *pfVar2 = fVar37;
  pfVar2[1] = fVar38;
  pfVar2[2] = fVar36;
  pfVar2[3] = fVar42;
  pRVar8->instStackSize = pRVar8->instStackSize + 1;
  local_8c = query->time;
  fVar39 = (query->p).field_0.field_0.x;
  fVar40 = (query->p).field_0.field_0.y;
  fVar41 = (query->p).field_0.field_0.z;
  local_90 = fVar39 * fVar45 + fVar40 * fVar52 + fVar41 * fVar57 + fVar23;
  local_98 = CONCAT44(fVar39 * fVar44 + fVar40 * fVar51 + fVar41 * fVar56 + fVar48,
                      fVar39 * fVar43 + fVar40 * fVar50 + fVar41 * fVar55 + fVar46);
  local_88 = query->radius * local_38;
  local_68 = *(long *)&(pIVar6->super_Geometry).field_0x58;
  local_58 = context->query_ws;
  local_48 = context->func;
  local_40 = context->userContext;
  local_30 = context->userPtr;
  local_60 = 0;
  local_28 = 0xffffffffffffffff;
  local_18 = local_58->radius;
  if (bVar26) {
    fStack_14 = local_18;
    fStack_10 = local_18;
    fStack_c = local_18;
    if (local_18 < INFINITY) {
      if (local_40->instStackSize != 0) {
        uVar27 = local_40->instStackSize - 1;
        pafVar1 = local_40->world2inst + uVar27;
        pfVar2 = local_40->world2inst[uVar27] + 4;
        pfVar3 = local_40->world2inst[uVar27] + 8;
        pfVar4 = local_40->world2inst[uVar27] + 0xc;
        fVar28 = *pfVar4 - *pfVar3 * local_18;
        fVar29 = pfVar4[1] - pfVar3[1] * local_18;
        fVar30 = pfVar4[2] - pfVar3[2] * local_18;
        fVar31 = pfVar4[3] - pfVar3[3] * local_18;
        fVar35 = -local_18 * *pfVar2;
        fVar36 = -local_18 * pfVar2[1];
        fVar37 = -local_18 * pfVar2[2];
        fVar38 = -local_18 * pfVar2[3];
        fVar43 = fVar35 + fVar28;
        fVar44 = fVar36 + fVar29;
        fVar45 = fVar37 + fVar30;
        fVar47 = fVar38 + fVar31;
        fVar39 = -local_18 * (*pafVar1)[0];
        fVar40 = -local_18 * (*pafVar1)[1];
        fVar41 = -local_18 * (*pafVar1)[2];
        fVar42 = -local_18 * (*pafVar1)[3];
        fVar59 = fVar39 + fVar43;
        fVar60 = fVar40 + fVar44;
        fVar61 = fVar41 + fVar45;
        fVar62 = fVar42 + fVar47;
        auVar21._4_4_ = fVar60;
        auVar21._0_4_ = fVar59;
        auVar21._8_4_ = fVar61;
        auVar21._12_4_ = fVar62;
        auVar32 = minps(_DAT_01f45a30,auVar21);
        auVar22._4_4_ = fVar60;
        auVar22._0_4_ = fVar59;
        auVar22._8_4_ = fVar61;
        auVar22._12_4_ = fVar62;
        auVar33 = maxps(_DAT_01f45a40,auVar22);
        fVar50 = *pfVar3 * local_18 + *pfVar4;
        fVar51 = pfVar3[1] * local_18 + pfVar4[1];
        fVar52 = pfVar3[2] * local_18 + pfVar4[2];
        fVar53 = pfVar3[3] * local_18 + pfVar4[3];
        fVar35 = fVar35 + fVar50;
        fVar36 = fVar36 + fVar51;
        fVar37 = fVar37 + fVar52;
        fVar38 = fVar38 + fVar53;
        fVar59 = fVar39 + fVar35;
        fVar60 = fVar40 + fVar36;
        fVar61 = fVar41 + fVar37;
        fVar62 = fVar42 + fVar38;
        auVar17._4_4_ = fVar60;
        auVar17._0_4_ = fVar59;
        auVar17._8_4_ = fVar61;
        auVar17._12_4_ = fVar62;
        auVar32 = minps(auVar32,auVar17);
        auVar18._4_4_ = fVar60;
        auVar18._0_4_ = fVar59;
        auVar18._8_4_ = fVar61;
        auVar18._12_4_ = fVar62;
        auVar33 = maxps(auVar33,auVar18);
        fVar59 = *pfVar2 * local_18;
        fVar60 = pfVar2[1] * local_18;
        fVar61 = pfVar2[2] * local_18;
        fVar62 = pfVar2[3] * local_18;
        fVar28 = fVar28 + fVar59;
        fVar29 = fVar29 + fVar60;
        fVar30 = fVar30 + fVar61;
        fVar31 = fVar31 + fVar62;
        fVar55 = fVar39 + fVar28;
        fVar56 = fVar40 + fVar29;
        fVar57 = fVar41 + fVar30;
        fVar58 = fVar42 + fVar31;
        auVar19._4_4_ = fVar56;
        auVar19._0_4_ = fVar55;
        auVar19._8_4_ = fVar57;
        auVar19._12_4_ = fVar58;
        auVar32 = minps(auVar32,auVar19);
        auVar20._4_4_ = fVar56;
        auVar20._0_4_ = fVar55;
        auVar20._8_4_ = fVar57;
        auVar20._12_4_ = fVar58;
        auVar33 = maxps(auVar33,auVar20);
        fVar59 = fVar59 + fVar50;
        fVar60 = fVar60 + fVar51;
        fVar61 = fVar61 + fVar52;
        fVar62 = fVar62 + fVar53;
        fVar39 = fVar39 + fVar59;
        fVar40 = fVar40 + fVar60;
        fVar41 = fVar41 + fVar61;
        fVar42 = fVar42 + fVar62;
        auVar13._4_4_ = fVar40;
        auVar13._0_4_ = fVar39;
        auVar13._8_4_ = fVar41;
        auVar13._12_4_ = fVar42;
        auVar32 = minps(auVar32,auVar13);
        auVar14._4_4_ = fVar40;
        auVar14._0_4_ = fVar39;
        auVar14._8_4_ = fVar41;
        auVar14._12_4_ = fVar42;
        auVar33 = maxps(auVar33,auVar14);
        fVar39 = local_18 * (*pafVar1)[0];
        fVar40 = local_18 * (*pafVar1)[1];
        fVar41 = local_18 * (*pafVar1)[2];
        local_18 = local_18 * (*pafVar1)[3];
        fVar43 = fVar43 + fVar39;
        fVar44 = fVar44 + fVar40;
        fVar45 = fVar45 + fVar41;
        fVar47 = fVar47 + local_18;
        auVar15._4_4_ = fVar44;
        auVar15._0_4_ = fVar43;
        auVar15._8_4_ = fVar45;
        auVar15._12_4_ = fVar47;
        auVar32 = minps(auVar32,auVar15);
        auVar16._4_4_ = fVar44;
        auVar16._0_4_ = fVar43;
        auVar16._8_4_ = fVar45;
        auVar16._12_4_ = fVar47;
        auVar33 = maxps(auVar33,auVar16);
        fVar35 = fVar35 + fVar39;
        fVar36 = fVar36 + fVar40;
        fVar37 = fVar37 + fVar41;
        fVar38 = fVar38 + local_18;
        auVar11._4_4_ = fVar36;
        auVar11._0_4_ = fVar35;
        auVar11._8_4_ = fVar37;
        auVar11._12_4_ = fVar38;
        auVar32 = minps(auVar32,auVar11);
        auVar12._4_4_ = fVar36;
        auVar12._0_4_ = fVar35;
        auVar12._8_4_ = fVar37;
        auVar12._12_4_ = fVar38;
        auVar33 = maxps(auVar33,auVar12);
        fVar28 = fVar28 + fVar39;
        fVar29 = fVar29 + fVar40;
        fVar30 = fVar30 + fVar41;
        fVar31 = fVar31 + local_18;
        auVar34._4_4_ = fVar29;
        auVar34._0_4_ = fVar28;
        auVar34._8_4_ = fVar30;
        auVar34._12_4_ = fVar31;
        auVar32 = minps(auVar32,auVar34);
        auVar10._4_4_ = fVar29;
        auVar10._0_4_ = fVar28;
        auVar10._8_4_ = fVar30;
        auVar10._12_4_ = fVar31;
        auVar34 = maxps(auVar33,auVar10);
        fVar39 = fVar39 + fVar59;
        fVar40 = fVar40 + fVar60;
        fVar41 = fVar41 + fVar61;
        local_18 = local_18 + fVar62;
        auVar33._4_4_ = fVar40;
        auVar33._0_4_ = fVar39;
        auVar33._8_4_ = fVar41;
        auVar33._12_4_ = local_18;
        auVar32 = minps(auVar32,auVar33);
        auVar9._4_4_ = fVar40;
        auVar9._0_4_ = fVar39;
        auVar9._8_4_ = fVar41;
        auVar9._12_4_ = local_18;
        auVar33 = maxps(auVar34,auVar9);
        local_18 = (auVar33._0_4_ - auVar32._0_4_) * 0.5;
        fStack_14 = (auVar33._4_4_ - auVar32._4_4_) * 0.5;
        fStack_10 = (auVar33._8_4_ - auVar32._8_4_) * 0.5;
        fStack_c = (auVar33._12_4_ - auVar32._12_4_) * 0.5;
      }
    }
  }
  else {
    local_18 = local_38 * local_18;
    fStack_14 = local_18;
    fStack_10 = local_18;
    fStack_c = local_18;
  }
  uVar25 = (**(code **)(local_68 + 0x88))(local_68 + 0x58,&local_98);
  pRVar8 = context->userContext;
  uVar27 = pRVar8->instStackSize - 1;
  pRVar8->instStackSize = uVar27;
  pRVar8->instID[uVar27] = 0xffffffff;
  pRVar8->instPrimID[pRVar8->instStackSize] = 0xffffffff;
  return (bool)uVar25;
}

Assistant:

bool InstanceIntersector1::pointQuery(PointQuery* query, PointQueryContext* context, const InstancePrimitive& prim)
    {
      const Instance* instance = prim.instance;

      const AffineSpace3fa local2world = instance->getLocal2World();
      const AffineSpace3fa world2local = instance->getWorld2Local();
      float similarityScale = 0.f;
      const bool similtude = context->query_type == POINT_QUERY_TYPE_SPHERE
                           && similarityTransform(world2local, &similarityScale);
      assert((similtude && similarityScale > 0) || !similtude);

      if (likely(instance_id_stack::push(context->userContext, prim.instID_, 0, world2local, local2world)))
      {
        PointQuery query_inst;
        query_inst.time = query->time;
        query_inst.p = xfmPoint(world2local, query->p); 
        query_inst.radius = query->radius * similarityScale;

        PointQueryContext context_inst(
          (Scene*)instance->object, 
          context->query_ws, 
          similtude ? POINT_QUERY_TYPE_SPHERE : POINT_QUERY_TYPE_AABB,
          context->func,
          context->userContext,
          similarityScale,
          context->userPtr);

        bool changed = instance->object->intersectors.pointQuery(&query_inst, &context_inst);
        instance_id_stack::pop(context->userContext);
        return changed;
      }
      return false;
    }